

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallFilesCommand.h
# Opt level: O2

cmCommand * __thiscall cmInstallFilesCommand::Clone(cmInstallFilesCommand *this)

{
  cmInstallFilesCommand *this_00;
  
  this_00 = (cmInstallFilesCommand *)operator_new(0x88);
  cmInstallFilesCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmInstallFilesCommand; }